

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void jacobi_ss_compute(int order,double alpha,double beta,double *xtab,double *weight)

{
  double *c;
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined4 in_register_0000003c;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_e8;
  double dp2;
  double p1;
  ulong local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  double *local_80;
  undefined1 local_78 [16];
  double *local_60;
  ulong local_58;
  double local_50;
  ulong local_48;
  double local_40;
  double local_38;
  double x;
  
  local_58 = CONCAT44(in_register_0000003c,order);
  local_78._8_4_ = in_XMM0_Dc;
  local_78._0_8_ = alpha;
  local_78._12_4_ = in_XMM0_Dd;
  if (alpha <= -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar7 = "  -1.0 < ALPHA is required.\n";
  }
  else {
    local_50 = beta;
    if (-1.0 < beta) {
      local_48 = (ulong)(uint)order;
      uVar5 = 0xffffffffffffffff;
      if (-1 < order) {
        uVar5 = (long)order * 8;
      }
      local_60 = (double *)operator_new__(uVar5);
      c = (double *)operator_new__(uVar5);
      if (0 < order) {
        dVar9 = (double)local_78._0_8_ + local_50;
        iVar2 = 0;
        lVar6 = 0;
        do {
          dVar8 = 0.0;
          iVar4 = (int)lVar6;
          if (dVar9 != 0.0 && local_50 - (double)local_78._0_8_ != 0.0) {
            dVar8 = (dVar9 * (local_50 - (double)local_78._0_8_)) /
                    (((double)iVar4 + dVar9) * ((double)(iVar4 + 2) + dVar9));
          }
          *(double *)((long)local_60 + lVar6 * 4) = dVar8;
          if (lVar6 == 0) {
            *c = 0.0;
          }
          else {
            dVar8 = (double)iVar2;
            *(double *)((long)c + lVar6 * 4) =
                 ((dVar8 + local_50) * (dVar8 + (double)local_78._0_8_) * dVar8 * 4.0 *
                 (dVar9 + dVar8)) /
                 (((double)(iVar4 + -1) + dVar9) *
                 ((double)iVar4 + dVar9) * ((double)iVar4 + dVar9) * ((double)(iVar4 + 1) + dVar9));
          }
          lVar6 = lVar6 + 2;
          iVar2 = iVar2 + 1;
        } while (local_48 * 2 != lVar6);
      }
      local_98._8_4_ = local_78._8_4_;
      local_98._0_8_ = (double)local_78._0_8_ + 1.0;
      local_98._12_4_ = local_78._12_4_;
      local_80 = weight;
      local_40 = lgamma((double)local_78._0_8_ + 1.0);
      dVar9 = lgamma(local_50 + 1.0);
      local_40 = dVar9 + local_40;
      local_b8 = (double)local_78._0_8_ + local_50;
      uStack_b0 = local_78._8_8_;
      dVar9 = lgamma(local_b8 + 2.0);
      local_a8 = exp(local_40 - dVar9);
      local_40 = 1.0;
      iVar2 = (int)local_58;
      if (1 < iVar2) {
        local_40 = 1.0;
        lVar6 = 0;
        do {
          local_40 = local_40 * c[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (local_48 - 1 != lVar6);
      }
      dVar9 = exp2(local_b8 + 1.0);
      if (0 < iVar2) {
        local_40 = local_40 * local_a8 * dVar9;
        iVar2 = (int)local_58;
        dVar10 = (double)iVar2;
        dVar8 = ((double)(iVar2 + -8) * 0.22) / dVar10 + 1.0;
        dVar9 = (double)(iVar2 * iVar2);
        uStack_b0 = local_78._8_8_ ^ 0x8000000000000000;
        local_b8 = (-((double)local_78._0_8_ * 0.28 + 1.67) / ((double)local_78._0_8_ * 0.37 + 1.0))
                   * dVar8 * ((local_50 * 8.0) / ((local_50 + 6.28) * dVar9) + 1.0);
        local_a8 = (-((double)local_78._0_8_ + 4.1) /
                   (((double)local_78._0_8_ * 0.156 + 1.0) * (double)local_98._0_8_)) *
                   ((((double)local_78._0_8_ * 0.12 + 1.0) * (double)(iVar2 + -8) * 0.06) / dVar10 +
                   1.0) * (((ABS((double)local_78._0_8_) * 0.25 + 1.0) * local_50 * 0.012) / dVar10
                          + 1.0);
        uStack_a0 = 0x8000000000000000;
        dVar11 = (double)local_78._0_8_ / dVar10;
        dVar12 = dVar11 * 0.83 * (local_50 / dVar10) +
                 dVar11 * 0.452 * dVar11 + (local_50 / dVar10) * 0.96 + dVar11 * 1.48 + 1.0;
        local_98._8_8_ = local_78._8_8_;
        local_98._0_8_ =
             (dVar12 - ((dVar11 * 0.768) / dVar10 + 2.78 / (double)(iVar2 * iVar2 + 4)) *
                       (double)local_98._0_8_) / dVar12;
        local_c0 = (1.0 / (((double)local_78._0_8_ * 8.0) /
                           (((double)local_78._0_8_ + 6.28) * dVar9) + 1.0)) *
                   (1.0 / dVar8) * ((local_50 * 0.37 + 1.0) / (local_50 * 0.28 + 1.67));
        local_d0 = (ulong)(iVar2 - 1U);
        local_c8 = (1.0 / (((double)local_78._0_8_ * 20.0) /
                           (((double)local_78._0_8_ + 7.5) * dVar9) + 1.0)) *
                   (1.0 / (((double)(iVar2 + -4) * 0.639) / ((double)(iVar2 + -4) * 0.71 + 1.0) +
                          1.0)) * ((local_50 * 0.235 + 1.0) / (local_50 * 0.119 + 0.766));
        p1 = (double)(long)(int)(iVar2 - 1U);
        uVar5 = 1;
        do {
          iVar4 = (int)uVar5;
          if (iVar4 == 3) {
            local_38 = (*xtab - local_38) * local_b8 + local_38;
          }
          else {
            if (iVar4 == 2) {
              dVar9 = (1.0 - local_38) * local_a8;
              goto LAB_001e83c9;
            }
            if (iVar4 == 1) {
              local_38 = (double)local_98._0_8_;
            }
            else if ((long)uVar5 < (long)p1) {
              local_38 = xtab[uVar5 - 2] * 3.0 + xtab[uVar5 - 3] * -3.0 + xtab[uVar5 - 4];
            }
            else {
              if (local_d0 == uVar5) {
                dVar9 = (local_38 - xtab[uVar5 - 3]) * local_c8;
              }
              else {
                if (local_48 != uVar5) goto LAB_001e8431;
                dVar9 = (local_38 - xtab[uVar5 - 3]) * local_c0;
              }
LAB_001e83c9:
              local_38 = dVar9 + local_38;
            }
          }
LAB_001e8431:
          jacobi_ss_root(&local_38,(int)local_48,(double)local_78._0_8_,local_50,&local_e8,&dp2,
                         local_60,c);
          xtab[uVar5 - 1] = local_38;
          local_80[uVar5 - 1] = local_40 / (local_e8 * dp2);
          uVar5 = uVar5 + 1;
        } while (iVar2 + 1 != uVar5);
      }
      if (1 < (int)local_58) {
        uVar5 = local_58 >> 1 & 0x7fffffff;
        pdVar1 = xtab + local_48;
        uVar3 = 0;
        do {
          pdVar1 = pdVar1 + -1;
          dVar9 = xtab[uVar3];
          xtab[uVar3] = *pdVar1;
          *pdVar1 = dVar9;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
        if (1 < (int)local_58) {
          pdVar1 = local_80 + local_48;
          uVar3 = 0;
          do {
            pdVar1 = pdVar1 + -1;
            dVar9 = local_80[uVar3];
            local_80[uVar3] = *pdVar1;
            *pdVar1 = dVar9;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
      }
      operator_delete__(local_60);
      operator_delete__(c);
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar7 = "  -1.0 < BETA is required.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  exit(1);
}

Assistant:

void jacobi_ss_compute ( int order, double alpha, double beta, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_COMPUTE computes a Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    Thanks to Xu Xiang of Fudan University for pointing out that
//    an earlier implementation of this routine was incorrect!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2007
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double an;
  double *b;
  double bn;
  double *c;
  double cc;
  double delta;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double r3;
  double x;
//
//  Check ALPHA and BETA.
//
  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < ALPHA is required.\n";
    exit ( 1 );
  }

  if ( beta <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < BETA is required.\n";
    exit ( 1 );
  }

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 1; i <= order; i++ )
  {
    if ( alpha + beta == 0.0 || beta - alpha == 0.0 )
    {
      b[i-1] = 0.0;
    }
    else
    {
      b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
             ( ( alpha + beta + double( 2 * i ) ) 
             * ( alpha + beta + double( 2 * i - 2 ) ) );
    }

    if ( i == 1 )
    {
      c[i-1] = 0.0;
    }
    else
    {
      c[i-1] = 4.0 * double( i - 1 ) 
         * ( alpha + double( i - 1 ) ) 
          * ( beta + double( i - 1 ) ) 
            * ( alpha + beta + double( i - 1 ) ) / 
            ( ( alpha + beta + double( 2 * i - 1 ) ) 
            * pow ( alpha + beta + double( 2 * i - 2 ), 2 ) 
            * ( alpha + beta + double( 2 * i - 3 ) ) );
    }
  }

  delta = exp ( lgamma ( alpha        + 1.0 ) 
              + lgamma (         beta + 1.0 ) 
              - lgamma ( alpha + beta + 2.0 ) );
  prod = 1.0;
  for ( i = 2; i <= order; i++ )
  {
    prod = prod * c[i-1];
  }
  cc = delta * pow ( 2.0, alpha + beta + 1.0 ) * prod;

  for ( i = 1; i <= order; i++ )
  {
    if ( i == 1 )
    {
      an = alpha / double( order );
      bn = beta / double( order );

      r1 = ( 1.0 + alpha ) 
        * ( 2.78 / ( 4.0 + double( order * order ) ) 
        + 0.768 * an / double( order ) );

      r2 = 1.0 + 1.48 * an + 0.96 * bn 
        + 0.452 * an * an + 0.83 * an * bn;

      x = ( r2 - r1 ) / r2;
    }
    else if ( i == 2 )
    {
      r1 = ( 4.1 + alpha ) / 
        ( ( 1.0 + alpha ) * ( 1.0 + 0.156 * alpha ) );

      r2 = 1.0 + 0.06 * ( double( order ) - 8.0 ) * 
        ( 1.0 + 0.12 * alpha ) / double( order );

      r3 = 1.0 + 0.012 * beta * 
        ( 1.0 + 0.25 * fabs ( alpha ) ) / double( order );

      x = x - r1 * r2 * r3 * ( 1.0 - x );
    }
    else if ( i == 3 )
    {
      r1 = ( 1.67 + 0.28 * alpha ) / ( 1.0 + 0.37 * alpha );

      r2 = 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order );

      r3 = 1.0 + 8.0 * beta / 
        ( ( 6.28 + beta ) * double( order * order ) );

      x = x - r1 * r2 * r3 * ( xtab[0] - x );
    }
    else if ( i < order - 1 )
    {
      x = 3.0 * xtab[i-2] - 3.0 * xtab[i-3] + xtab[i-4];
    }
    else if ( i == order - 1 )
    {
      r1 = ( 1.0 + 0.235 * beta ) / ( 0.766 + 0.119 * beta );

      r2 = 1.0 / ( 1.0 + 0.639 
        * ( double( order ) - 4.0 ) 
        / ( 1.0 + 0.71 * ( double( order ) - 4.0 ) ) );

      r3 = 1.0 / ( 1.0 + 20.0 * alpha / ( ( 7.5 + alpha ) * 
        double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    else if ( i == order )
    {
      r1 = ( 1.0 + 0.37 * beta ) / ( 1.67 + 0.28 * beta );

      r2 = 1.0 / 
        ( 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order ) );

      r3 = 1.0 / ( 1.0 + 8.0 * alpha / 
        ( ( 6.28 + alpha ) * double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    jacobi_ss_root ( &x, order, alpha, beta, &dp2, &p1, b, c );

    xtab[i-1] = x;
    weight[i-1] = cc / ( dp2 * p1 );
  }
//
//  Reverse the order of the values.
//
  r8vec_reverse ( order, xtab );
  r8vec_reverse ( order, weight );

  delete [] b;
  delete [] c;

  return;
}